

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *this)

{
  char cVar1;
  num_writer f;
  char cVar2;
  int iVar3;
  int iVar4;
  int num_digits;
  long lVar5;
  int iVar6;
  string_view prefix;
  string groups;
  locale_ref in_stack_ffffffffffffff98;
  locale_ref in_stack_ffffffffffffffa0;
  undefined7 uStack_3f;
  long local_38;
  long local_30;
  
  grouping_impl<char>(in_stack_ffffffffffffffa0);
  if (local_30 == 0) {
    on_dec(this);
  }
  else {
    cVar2 = thousands_sep_impl<char>(in_stack_ffffffffffffff98);
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      iVar3 = count_digits(this->abs_value);
      num_digits = (int)local_30 + iVar3;
      iVar4 = iVar3;
      for (lVar5 = 0; local_30 != lVar5; lVar5 = lVar5 + 1) {
        cVar1 = *(char *)(local_38 + lVar5);
        iVar6 = iVar4 - cVar1;
        if ((iVar6 == 0 || iVar4 < cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) {
          num_digits = iVar3 + (int)lVar5;
          if (local_30 != lVar5) goto LAB_00134294;
          break;
        }
        iVar4 = iVar6;
      }
      num_digits = (iVar4 + -1) / (int)*(char *)(local_38 + -1 + local_30) + num_digits;
LAB_00134294:
      f._17_7_ = uStack_3f;
      f.sep = cVar2;
      f.size = num_digits;
      f.abs_value = this->abs_value;
      f.groups = (string *)&local_38;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
      ::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                  *)this->writer,num_digits,prefix,*this->specs,f);
    }
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }